

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O1

void spdlog::throw_spdlog_ex(string *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  undefined8 *puVar3;
  pointer local_30;
  undefined8 local_20;
  undefined4 uStack_18;
  undefined4 uStack_14;
  
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_30 = (msg->_M_dataplus)._M_p;
  paVar1 = &msg->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30 == paVar1) {
    local_20 = paVar1->_M_allocated_capacity;
    uStack_18 = *(undefined4 *)((long)&msg->field_2 + 8);
    uStack_14 = *(undefined4 *)((long)&msg->field_2 + 0xc);
    local_30 = (pointer)&local_20;
  }
  else {
    local_20 = paVar1->_M_allocated_capacity;
  }
  sVar2 = msg->_M_string_length;
  (msg->_M_dataplus)._M_p = (pointer)paVar1;
  msg->_M_string_length = 0;
  (msg->field_2)._M_local_buf[0] = '\0';
  *puVar3 = &PTR__spdlog_ex_001b2f00;
  puVar3[1] = puVar3 + 3;
  if (local_30 == (pointer)&local_20) {
    *(undefined4 *)(puVar3 + 3) = (undefined4)local_20;
    *(undefined4 *)((long)puVar3 + 0x1c) = local_20._4_4_;
    *(undefined4 *)(puVar3 + 4) = uStack_18;
    *(undefined4 *)((long)puVar3 + 0x24) = uStack_14;
  }
  else {
    puVar3[1] = local_30;
    puVar3[3] = local_20;
  }
  puVar3[2] = sVar2;
  local_20 = local_20 & 0xffffffffffffff00;
  __cxa_throw(puVar3,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

SPDLOG_INLINE void throw_spdlog_ex(std::string msg) { SPDLOG_THROW(spdlog_ex(std::move(msg))); }